

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

void __thiscall cfd::core::Transaction::SetFromHex(Transaction *this,string *hex_string)

{
  wally_tx_input *__first;
  uint32_t version;
  uchar *puVar1;
  wally_tx_output *pwVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pTVar6;
  bool bVar7;
  wally_tx_witness_stack *pwVar8;
  CfdException *pCVar9;
  _func_int **pp_Var10;
  uint8_t *p_byte_data;
  pointer pTVar11;
  Transaction *pTVar12;
  pointer pTVar13;
  undefined4 uVar14;
  long lVar15;
  ulong uVar16;
  pointer data_size;
  Amount AVar17;
  int ret;
  wally_tx *tx_pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_buf;
  uint64_t txout_num;
  size_t num_size;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> vout_work;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> vin_work;
  TxIn txin;
  ByteData tx_byte;
  int local_1e4;
  wally_tx *local_1e0;
  Transaction *local_1d8;
  wally_tx *local_1d0;
  _func_int **local_1c8;
  Txid local_1c0;
  undefined4 local_19c;
  ByteData local_198;
  Amount local_180;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> local_168;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> local_148;
  undefined1 local_130 [144];
  void *local_a0 [3];
  Script local_88;
  ScriptWitness local_50;
  
  local_1d0 = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  local_148.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0 = (wally_tx *)0x0;
  local_1d8 = this;
  local_1e4 = wally_tx_from_hex((hex_string->_M_dataplus)._M_p,0,&local_1e0);
  if ((((local_1e4 == 0) && (local_1e0->num_inputs == 0)) && (local_1e0->num_outputs == 0)) &&
     (0x14 < hex_string->_M_string_length)) {
    wally_tx_free(local_1e0);
    local_1e0 = (wally_tx *)0x0;
    local_1e4 = -2;
  }
  if (local_1e4 != -2) {
    uVar14 = 0;
    goto LAB_00330665;
  }
  StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,(string *)hex_string
            );
  ByteData::ByteData((ByteData *)&local_88,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
  if ((_func_int **)local_130._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_130._0_8_);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c0,
                     (ByteData *)&local_88);
  if ((hex_string->_M_string_length < 0x14) || (*(char *)((long)local_1c0._vptr_Txid + 4) != '\0'))
  {
LAB_00330642:
    uVar14 = 0;
  }
  else {
    version = *(uint32_t *)local_1c0._vptr_Txid;
    if ((hex_string->_M_string_length == 0x14) &&
       (*(char *)((long)local_1c0._vptr_Txid + 5) == '\0')) {
      local_1e4 = wally_tx_init_alloc(version,*(uint32_t *)((long)local_1c0._vptr_Txid + 6),0,0,
                                      &local_1e0);
      if (local_1e4 != 0) {
        local_130._0_8_ = "cfdcore_transaction.cpp";
        local_130._8_4_ = 0x152;
        local_130._16_8_ = "SetFromHex";
        logger::log<int&>((CfdSourceLocation *)local_130,kCfdLogLevelWarning,
                          "wally_tx_init_alloc NG[{}] ",&local_1e4);
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        local_130._0_8_ = local_130 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_130,"transaction data generate error.","");
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_130);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_130._0_8_ = "cfdcore_transaction.cpp";
      local_130._8_4_ = 0x156;
      local_130._16_8_ = "SetFromHex";
      logger::log<>((CfdSourceLocation *)local_130,kCfdLogLevelInfo,"call wally_tx_init_alloc");
      goto LAB_00330642;
    }
    local_198.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_180.amount_ = 0;
    p_byte_data = (uint8_t *)((long)local_1c0._vptr_Txid + 5);
    data_size = local_1c0.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + (-9 - (long)local_1c0._vptr_Txid);
    bVar7 = AbstractTransaction::GetVariableInt
                      (p_byte_data,(size_t)data_size,(uint64_t *)&local_198,(size_t *)&local_180);
    if ((!bVar7) ||
       (bVar7 = CheckTxOutBuffer(p_byte_data,(size_t)data_size,
                                 (uint64_t)
                                 local_198.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,local_180.amount_,
                                 (void *)0x0,
                                 (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)0x0)
       , !bVar7)) goto LAB_00330642;
    local_1e4 = wally_tx_init_alloc(version,*(uint32_t *)(p_byte_data + (long)data_size),0,0,
                                    &local_1e0);
    if (local_1e4 != 0) {
      local_130._0_8_ = "cfdcore_transaction.cpp";
      local_130._8_4_ = 0x16d;
      local_130._16_8_ = "SetFromHex";
      logger::log<int&>((CfdSourceLocation *)local_130,kCfdLogLevelWarning,
                        "wally_tx_init_alloc NG[{}] ",&local_1e4);
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      local_130._0_8_ = local_130 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,"transaction data generate error.","");
      CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_130);
      __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_130._0_8_ = "cfdcore_transaction.cpp";
    local_130._8_4_ = 0x172;
    local_130._16_8_ = "SetFromHex";
    logger::log<>((CfdSourceLocation *)local_130,kCfdLogLevelInfo,"call wally_tx_init_alloc");
    uVar14 = (undefined4)CONCAT71((uint7)(uint3)(version >> 8),1);
    CheckTxOutBuffer(p_byte_data,(size_t)data_size,
                     (uint64_t)
                     local_198.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,local_180.amount_,local_1e0,&local_168);
  }
  if (local_1c0._vptr_Txid != (_func_int **)0x0) {
    operator_delete(local_1c0._vptr_Txid);
  }
  if (local_88._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_88._vptr_Script);
  }
LAB_00330665:
  if (local_1e4 != 0) {
    local_130._0_8_ = "cfdcore_transaction.cpp";
    local_130._8_4_ = 0x17f;
    local_130._16_8_ = "SetFromHex";
    logger::log<int&>((CfdSourceLocation *)local_130,kCfdLogLevelWarning,"wally_tx_from_hex NG[{}] "
                      ,&local_1e4);
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_130._0_8_ = local_130 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"transaction data invalid.","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_130);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  (local_1d8->super_AbstractTransaction).wally_tx_pointer_ = local_1e0;
  local_19c = uVar14;
  if (local_1e0->num_inputs != 0) {
    pp_Var10 = (_func_int **)0x0;
    do {
      __first = local_1e0->inputs + (long)pp_Var10;
      local_1c8 = pp_Var10;
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_198,__first->txhash,
                 (uchar *)&local_1e0->inputs[(long)pp_Var10].index,(allocator_type *)local_130);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_180,__first->script,
                 __first->script + __first->script_len,(allocator_type *)local_130);
      ByteData::ByteData((ByteData *)local_130,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180);
      Script::Script(&local_88,(ByteData *)local_130);
      if ((_func_int **)local_130._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_130._0_8_);
      }
      ByteData256::ByteData256
                ((ByteData256 *)local_a0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_198);
      Txid::Txid(&local_1c0,(ByteData256 *)local_a0);
      AbstractTxIn::AbstractTxIn
                ((AbstractTxIn *)local_130,&local_1c0,__first->index,__first->sequence,&local_88);
      local_130._0_8_ = &PTR__AbstractTxIn_007408e8;
      local_1c0._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (local_1c0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_a0[0] != (void *)0x0) {
        operator_delete(local_a0[0]);
      }
      if (((__first->witness != (wally_tx_witness_stack *)0x0) && (__first->witness->num_items != 0)
          ) && (pwVar8 = __first->witness, pwVar8->num_items != 0)) {
        lVar15 = 8;
        uVar16 = 0;
        do {
          puVar1 = *(uchar **)((long)pwVar8->items + lVar15 + -8);
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1c0,puVar1,
                     puVar1 + *(long *)((long)&pwVar8->items->witness + lVar15),
                     (allocator_type *)local_a0);
          ByteData::ByteData((ByteData *)local_a0,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c0);
          AbstractTxIn::AddScriptWitnessStack
                    (&local_50,(AbstractTxIn *)local_130,(ByteData *)local_a0);
          local_50._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00735628;
          ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                    (&local_50.witness_stack_);
          if (local_a0[0] != (void *)0x0) {
            operator_delete(local_a0[0]);
          }
          if (local_1c0._vptr_Txid != (_func_int **)0x0) {
            operator_delete(local_1c0._vptr_Txid);
          }
          uVar16 = uVar16 + 1;
          pwVar8 = __first->witness;
          lVar15 = lVar15 + 0x10;
        } while (uVar16 < pwVar8->num_items);
      }
      ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::push_back
                (&local_148,(value_type *)local_130);
      AbstractTxIn::~AbstractTxIn((AbstractTxIn *)local_130);
      Script::~Script(&local_88);
      if ((void *)local_180.amount_ != (void *)0x0) {
        operator_delete((void *)local_180.amount_);
      }
      if (local_198.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_198.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pp_Var10 = (_func_int **)((long)local_1c8 + 1);
    } while (pp_Var10 < (_func_int **)local_1e0->num_inputs);
  }
  local_130._0_8_ = "cfdcore_transaction.cpp";
  local_130._8_4_ = 0x1a7;
  local_130._16_8_ = "SetFromHex";
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)local_130,kCfdLogLevelInfo,"num_outputs={} ",
             &local_1e0->num_outputs);
  if (((char)local_19c == '\0') && (local_1e0->num_outputs != 0)) {
    lVar15 = 0x10;
    uVar16 = 0;
    local_1c8 = (_func_int **)&PTR__AbstractTxOut_007407d8;
    do {
      pwVar2 = local_1e0->outputs;
      puVar1 = *(uchar **)((long)pwVar2 + lVar15 + -8);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1c0,puVar1,
                 puVar1 + *(long *)((long)&pwVar2->satoshi + lVar15),(allocator_type *)local_130);
      AVar17 = Amount::CreateBySatoshiAmount(*(int64_t *)((long)pwVar2 + lVar15 + -0x10));
      local_180.amount_ = AVar17.amount_;
      local_180.ignore_check_ = AVar17.ignore_check_;
      ByteData::ByteData(&local_198,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c0);
      Script::Script(&local_88,&local_198);
      AbstractTxOut::AbstractTxOut((AbstractTxOut *)local_130,&local_180,&local_88);
      local_130._0_8_ = &PTR__AbstractTxOut_007408a0;
      Script::~Script(&local_88);
      if (local_198.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_198.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::push_back
                (&local_168,(value_type *)local_130);
      local_130._0_8_ = local_1c8;
      Script::~Script((Script *)(local_130 + 0x18));
      if (local_1c0._vptr_Txid != (_func_int **)0x0) {
        operator_delete(local_1c0._vptr_Txid);
      }
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x70;
    } while (uVar16 < local_1e0->num_outputs);
  }
  pTVar12 = local_1d8;
  if (local_1d0 != (wally_tx *)0x0) {
    wally_tx_free(local_1d0);
    pTVar3 = (pTVar12->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar4 = (pTVar12->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pTVar11 = pTVar3;
    if (pTVar4 != pTVar3) {
      do {
        (**(pTVar11->super_AbstractTxIn)._vptr_AbstractTxIn)(pTVar11);
        pTVar11 = pTVar11 + 1;
      } while (pTVar11 != pTVar4);
      (local_1d8->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
      _M_impl.super__Vector_impl_data._M_finish = pTVar3;
      pTVar12 = local_1d8;
    }
    pTVar5 = (pTVar12->vout_).
             super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar6 = (pTVar12->vout_).
             super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar13 = pTVar5;
    if (pTVar6 != pTVar5) {
      do {
        (**(pTVar13->super_AbstractTxOut)._vptr_AbstractTxOut)(pTVar13);
        pTVar13 = pTVar13 + 1;
      } while (pTVar13 != pTVar6);
      (local_1d8->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
      _M_impl.super__Vector_impl_data._M_finish = pTVar5;
    }
  }
  pTVar12 = local_1d8;
  ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator=
            (&local_1d8->vin_,&local_148);
  ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator=
            (&pTVar12->vout_,&local_168);
  ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector(&local_168);
  ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::~vector(&local_148);
  return;
}

Assistant:

void Transaction::SetFromHex(const std::string &hex_string) {
  void *original_address = wally_tx_pointer_;
  bool append_txout = false;
  std::vector<TxIn> vin_work;
  std::vector<TxOut> vout_work;

  // It is assumed that tx information has been created.
  // (If it is not created, it will cause inconsistency)
  struct wally_tx *tx_pointer = NULL;
  int ret = wally_tx_from_hex(hex_string.c_str(), 0, &tx_pointer);
  if (ret == WALLY_OK) {
    if ((tx_pointer->num_inputs == 0) && (tx_pointer->num_outputs == 0) &&
        (hex_string.size() > kTransactionMinimumHexSize)) {
      // Judged as an invalid analysis condition when txin is 0 and txout is 1,
      // and enters the exception route
      // (libwally misidentifies as witness tx)
      wally_tx_free(tx_pointer);
      tx_pointer = NULL;
      ret = WALLY_EINVAL;
    }
  }

  if (ret == WALLY_EINVAL) {
    ByteData tx_byte = StringUtil::StringToByte(hex_string);
    const std::vector<uint8_t> &tx_buf = tx_byte.GetBytes();
    const uint8_t *address_pointer = tx_buf.data();

    // If the minimum size, perform analysis
    if (hex_string.size() >= kTransactionMinimumHexSize) {
      uint32_t version = 0;
      uint32_t lock_time = 0;
      memcpy(&version, address_pointer, sizeof(version));
      address_pointer += sizeof(version);
      if (*address_pointer != 0) {
        // marker is 1 or txin is greater than 1
        // Since type can be analyzed with libwally, treated as invalid data.
      } else {
        // txin is 0 or marker is 0
        ++address_pointer;
        if ((*address_pointer == 0) &&
            (hex_string.size() == kTransactionMinimumHexSize)) {
          // txout is 0
          ++address_pointer;
          memcpy(&lock_time, address_pointer, sizeof(lock_time));
          ret = wally_tx_init_alloc(version, lock_time, 0, 0, &tx_pointer);
          if (ret != WALLY_OK) {
            warn(CFD_LOG_SOURCE, "wally_tx_init_alloc NG[{}] ", ret);
            throw CfdException(
                kCfdIllegalArgumentError, "transaction data generate error.");
          }
          info(CFD_LOG_SOURCE, "call wally_tx_init_alloc");
        } else {
          // Check remaining size and check if txin is 0 and txout is 1 or more
          const uint8_t *start_address = tx_buf.data();
          size_t size = address_pointer - start_address;
          uint64_t txout_num = 0;
          size_t num_size = 0;
          // Subtract the size up to the txout area and the locktime
          // from the txbuf size.
          size_t buf_size = tx_buf.size() - size - sizeof(uint32_t);
          if (!GetVariableInt(
                  address_pointer, buf_size, &txout_num, &num_size)) {
            // Invalid
          } else if (!CheckTxOutBuffer(
                         address_pointer, buf_size, txout_num, num_size)) {
            // Invalid
          } else {
            // txout OK
            // locktime copy
            const uint8_t *work_address = address_pointer + buf_size;
            memcpy(&lock_time, work_address, sizeof(lock_time));
            ret = wally_tx_init_alloc(version, lock_time, 0, 0, &tx_pointer);
            if (ret != WALLY_OK) {
              warn(CFD_LOG_SOURCE, "wally_tx_init_alloc NG[{}] ", ret);
              throw CfdException(
                  kCfdIllegalArgumentError,
                  "transaction data generate error.");
            }
            info(CFD_LOG_SOURCE, "call wally_tx_init_alloc");
            append_txout = true;
            // Add data to TxOut again
            CheckTxOutBuffer(
                address_pointer, buf_size, txout_num, num_size, tx_pointer,
                &vout_work);
          }
        }
      }
    }
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }
  wally_tx_pointer_ = tx_pointer;

  try {
    // create TxIn and TxOut
    for (size_t index = 0; index < tx_pointer->num_inputs; ++index) {
      struct wally_tx_input *txin_item = &tx_pointer->inputs[index];
      std::vector<uint8_t> txid_buf(
          txin_item->txhash, txin_item->txhash + sizeof(txin_item->txhash));
      std::vector<uint8_t> script_buf(
          txin_item->script, txin_item->script + txin_item->script_len);
      Script unlocking_script = Script(ByteData(script_buf));
      /* Temporarily comment out
      if (!unlocking_script.IsPushOnly()) {
        warn(CFD_LOG_SOURCE, "IsPushOnly() false.");
        throw CfdException(
            kCfdIllegalArgumentError,
            "unlocking script error. "
            "The script needs to be push operator only.");
      } */
      TxIn txin(
          Txid(ByteData256(txid_buf)), txin_item->index, txin_item->sequence,
          unlocking_script);
      if ((txin_item->witness != NULL) &&
          (txin_item->witness->num_items != 0)) {
        for (size_t w_index = 0; w_index < txin_item->witness->num_items;
             ++w_index) {
          struct wally_tx_witness_item *witness_stack;
          witness_stack = &txin_item->witness->items[w_index];
          const std::vector<uint8_t> witness_buf(
              witness_stack->witness,
              witness_stack->witness + witness_stack->witness_len);
          txin.AddScriptWitnessStack(ByteData(witness_buf));
        }
      }
      vin_work.push_back(txin);
    }

    info(CFD_LOG_SOURCE, "num_outputs={} ", tx_pointer->num_outputs);
    if (!append_txout) {
      for (size_t index = 0; index < tx_pointer->num_outputs; ++index) {
        struct wally_tx_output *txout_item = &tx_pointer->outputs[index];
        std::vector<uint8_t> script_buf(
            txout_item->script, txout_item->script + txout_item->script_len);
        TxOut txout(
            Amount::CreateBySatoshiAmount(txout_item->satoshi),
            Script(ByteData(script_buf)));
        vout_work.push_back(txout);
      }
    }
    // If the copy process is successful, free the old buffer
    if (original_address != NULL) {
      wally_tx_free(static_cast<struct wally_tx *>(original_address));
      vin_.clear();
      vout_.clear();
    }
    vin_ = vin_work;
    vout_ = vout_work;
  } catch (const CfdException &exception) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw exception;
  } catch (...) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw CfdException(kCfdUnknownError);
  }
}